

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O1

int IDAGetJac(void *ida_mem,SUNMatrix *J)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_18;
  IDAMem local_10;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDAGetJac",&local_10,&local_18);
  if (iVar1 == 0) {
    *J = local_18->J;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetJac(void* ida_mem, SUNMatrix* J)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure; set output and return */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return retval; }
  *J = idals_mem->J;
  return IDALS_SUCCESS;
}